

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O2

void __thiscall adios2::transport::NullTransport::Seek(NullTransport *this,size_t start)

{
  NullTransportImpl *pNVar1;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pNVar1 = (this->Impl)._M_t.
           super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>.
           _M_head_impl;
  if (pNVar1->IsOpen == false) {
    std::__cxx11::string::string((string *)&local_30,"Toolkit",&local_91);
    std::__cxx11::string::string((string *)&local_50,"transport::NullTransport",&local_92);
    std::__cxx11::string::string((string *)&local_70,"Seek",&local_93);
    std::__cxx11::string::string((string *)&local_90,"transport is not open yet",&local_94);
    helper::Throw<std::runtime_error>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    pNVar1 = (this->Impl)._M_t.
             super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
             .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>.
             _M_head_impl;
  }
  pNVar1->CurPos = start;
  return;
}

Assistant:

void NullTransport::Seek(const size_t start)
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Toolkit", "transport::NullTransport", "Seek",
                                          "transport is not open yet");
    }
    Impl->CurPos = start;
}